

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

DynamicType * __thiscall
Js::PathTypeHandlerBase::PromoteType<true>
          (PathTypeHandlerBase *this,DynamicType *predecessorType,PathTypeSuccessorKey key,
          bool shareType,ScriptContext *scriptContext,DynamicObject *instance,
          PropertyIndex *propertyIndex)

{
  byte bVar1;
  uint8 oldPathSize;
  uint uVar2;
  JavascriptLibrary *pJVar3;
  Recycler *recycler;
  Data *pDVar4;
  TypePath *pTVar5;
  RecyclerWeakReference<Js::DynamicObject> *pRVar6;
  DynamicType *pDVar7;
  code *pcVar8;
  bool bVar9;
  bool bVar10;
  PropertyTypes PVar11;
  PropertyIndex index;
  PropertyIndex PVar12;
  undefined4 *puVar14;
  PropertyRecord *propId;
  ObjectSlotAttributes *oldAttributes;
  PathTypeSetterSlotIndex *oldSetters;
  RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstanceBefore;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  PathTypeHandlerBase *pPVar15;
  Recycler *alloc;
  RecyclerWeakReference<Js::DynamicType> *typeWeakRef;
  uint uVar16;
  ushort uVar17;
  uint uVar18;
  char16_t *this_00;
  uint16 inlineSlotCapacity;
  uint propertyId;
  char *instance_00;
  Type TVar19;
  Type offsetOfInlineSlots;
  undefined1 local_f0 [8];
  TrackAllocData data;
  RecyclerWeakReference<Js::DynamicType> *nextTypeWeakRef;
  char local_94;
  PathTypeSetterSlotIndex *local_68;
  ObjectSlotAttributes *local_58;
  TypePath *local_50;
  DynamicType *local_40;
  PathTypeHandlerWithAttr *local_38;
  int iVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  if (propertyIndex == (PropertyIndex *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar14 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x7d1,"(propertyIndex != nullptr)","propertyIndex != nullptr");
    if (!bVar9) goto LAB_00c527b8;
    *puVar14 = 0;
  }
  pJVar3 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  recycler = scriptContext->recycler;
  data.line = 0;
  data._36_4_ = 0;
  propertyId = key.propertyId;
  propId = ScriptContext::GetPropertyName(scriptContext,propertyId);
  bVar9 = GetSuccessor(this,key,(RecyclerWeakReference<Js::DynamicType> **)&data.line);
  TVar19 = key.attributes;
  if ((bVar9) && (local_40 = *(DynamicType **)data._32_8_, local_40 != (DynamicType *)0x0)) {
    scriptContext->cacheCount = scriptContext->cacheCount + 1;
    local_38 = (PathTypeHandlerWithAttr *)(local_40->typeHandler).ptr;
    if (((local_38->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
         propertyTypes & 0x40) >> 6 != ((this->super_DynamicTypeHandler).propertyTypes & 0x40) >> 6)
    {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar14 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x8c3,
                                  "(nextPath->GetIsInlineSlotCapacityLocked() == this->GetIsInlineSlotCapacityLocked())"
                                  ,
                                  "nextPath->GetIsInlineSlotCapacityLocked() == this->GetIsInlineSlotCapacityLocked()"
                                 );
      if (!bVar9) goto LAB_00c527b8;
      *puVar14 = 0;
    }
    iVar13 = (*(local_38->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
               super_DynamicTypeHandler._vptr_DynamicTypeHandler[0xc])(local_38,propId);
    index = (PropertyIndex)iVar13;
    bVar1 = (local_38->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
            super_DynamicTypeHandler.flags;
    if (((DAT_0145c381 != 1) || ((bVar1 & 8) == 0)) &&
       (((bVar1 & 0x10) == 0 || (local_40->isShared == false)))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar14 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x8c8,
                                  "((FixPropsOnPathTypes() && nextPath->GetMayBecomeShared()) || (nextPath->GetIsShared() && nextType->GetIsShared()))"
                                  ,
                                  "(FixPropsOnPathTypes() && nextPath->GetMayBecomeShared()) || (nextPath->GetIsShared() && nextType->GetIsShared())"
                                 );
      if (!bVar9) goto LAB_00c527b8;
      *puVar14 = 0;
    }
    if (((DAT_0145c381 & 1) != 0) && (local_40->isShared == false)) {
      if (((local_38->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
           super_DynamicTypeHandler.flags & 0x10) == 0) {
        AddBlankFieldAt((PathTypeHandlerBase *)local_38,propId->pid,index,scriptContext);
        DoShareTypeHandlerInternal<true>((PathTypeHandlerBase *)local_38,scriptContext);
      }
      DynamicType::ShareType(local_40);
    }
  }
  else {
    local_50 = (this->typePath).ptr;
    oldPathSize = ((local_50->data).ptr)->pathSize;
    iVar13 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])(this);
    oldAttributes = (ObjectSlotAttributes *)CONCAT44(extraout_var,iVar13);
    iVar13 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6f])(this);
    oldSetters = (PathTypeSetterSlotIndex *)CONCAT44(extraout_var_00,iVar13);
    pDVar4 = (((this->typePath).ptr)->data).ptr;
    bVar1 = pDVar4->pathLength;
    uVar17 = (this->super_DynamicTypeHandler).unusedBytes >> 1;
    if (uVar17 < bVar1) {
      this_00 = L"branching";
      bVar9 = false;
    }
    else {
      bVar9 = bVar1 == pDVar4->pathSize;
      this_00 = L"advancing";
    }
    oldSingletonInstanceBefore = GetSingletonInstance(this);
    TraceFixedFieldsBeforeTypeHandlerChange
              (this_00,L"PathTypeHandler",L"PathTypeHandler",instance,
               &this->super_DynamicTypeHandler,predecessorType,oldSingletonInstanceBefore);
    if (uVar17 < bVar1) {
      uVar16 = (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1);
      bVar9 = (bool)((DAT_0145c365 ^ 1) & ((this->super_DynamicTypeHandler).flags & 0x18) != 0);
      pPVar15 = (PathTypeHandlerBase *)(this->typePath).ptr;
      if (oldSetters == (PathTypeSetterSlotIndex *)0x0) {
        local_50 = TypePath::Branch<false>
                             ((TypePath *)pPVar15,recycler,uVar16,bVar9,(ObjectSlotAttributes *)0x0)
        ;
      }
      else {
        local_50 = TypePath::Branch<true>((TypePath *)pPVar15,recycler,uVar16,bVar9,oldAttributes);
      }
      scriptContext->branchCount = scriptContext->branchCount + 1;
      scriptContext->objectLiteralBranchCount = scriptContext->objectLiteralBranchCount + 1;
      if (TVar19 == ObjectSlotAttr_Default && oldAttributes == (ObjectSlotAttributes *)0x0) {
        local_58 = (ObjectSlotAttributes *)0x0;
      }
      else {
        local_58 = UpdateAttributes(pPVar15,recycler,oldAttributes,oldPathSize,
                                    ((local_50->data).ptr)->pathSize);
      }
      if (TVar19 == ObjectSlotAttr_Setter || oldSetters != (PathTypeSetterSlotIndex *)0x0) {
        local_68 = UpdateSetterSlots(this,recycler,oldSetters,oldPathSize,
                                     ((local_50->data).ptr)->pathSize);
      }
      else {
        local_68 = (PathTypeSetterSlotIndex *)0x0;
      }
      if (DAT_0145c381 == 1) {
        bVar9 = HasSingletonInstanceOnlyIfNeeded(this);
        if (!bVar9) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar14 = 1;
          bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                      ,0x816,"(this->HasSingletonInstanceOnlyIfNeeded())",
                                      "this->HasSingletonInstanceOnlyIfNeeded()");
          if (!bVar9) goto LAB_00c527b8;
          *puVar14 = 0;
        }
        pTVar5 = (this->typePath).ptr;
        pRVar6 = (pTVar5->singletonInstance).ptr;
        if ((pRVar6 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
           ((DynamicObject *)(pRVar6->super_RecyclerWeakReferenceBase).strongRef == instance)) {
          (pTVar5->singletonInstance).ptr = (RecyclerWeakReference<Js::DynamicObject> *)0x0;
        }
      }
LAB_00c52114:
      if (TVar19 == ObjectSlotAttr_Setter) goto LAB_00c5211a;
      uVar16 = TypePath::AddInternal<true>(local_50,propId);
      local_94 = '\0';
    }
    else {
      if (bVar9) {
        pPVar15 = (PathTypeHandlerBase *)(this->typePath).ptr;
        local_50 = TypePath::Grow((TypePath *)pPVar15,recycler);
        if (TVar19 == ObjectSlotAttr_Default && oldAttributes == (ObjectSlotAttributes *)0x0) {
          local_58 = (ObjectSlotAttributes *)0x0;
        }
        else {
          local_58 = UpdateAttributes(pPVar15,recycler,oldAttributes,oldPathSize,
                                      ((local_50->data).ptr)->pathSize);
        }
        if (TVar19 == ObjectSlotAttr_Setter || oldSetters != (PathTypeSetterSlotIndex *)0x0) {
          local_68 = UpdateSetterSlots(this,recycler,oldSetters,oldPathSize,
                                       ((local_50->data).ptr)->pathSize);
        }
        else {
          local_68 = (PathTypeSetterSlotIndex *)0x0;
        }
        pTVar5 = (this->typePath).ptr;
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        pPVar15 = this;
        do {
          (*(pPVar15->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6a])(pPVar15,local_50);
          if ((oldAttributes != (ObjectSlotAttributes *)0x0) &&
             (iVar13 = (*(pPVar15->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])
                                 (pPVar15),
             (ObjectSlotAttributes *)CONCAT44(extraout_var_01,iVar13) == oldAttributes)) {
            (*(pPVar15->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6d])(pPVar15,local_58);
          }
          if ((oldSetters != (PathTypeSetterSlotIndex *)0x0) &&
             (iVar13 = (*(pPVar15->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6f])
                                 (pPVar15),
             (PathTypeSetterSlotIndex *)CONCAT44(extraout_var_02,iVar13) == oldSetters)) {
            (*(pPVar15->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x72])(pPVar15,local_68);
          }
          pDVar7 = (pPVar15->predecessorType).ptr;
          if (pDVar7 == (DynamicType *)0x0) break;
          iVar13 = (*((pDVar7->typeHandler).ptr)->_vptr_DynamicTypeHandler[0x4e])();
          if (iVar13 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar14 = 1;
            bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                        ,0x844,
                                        "(currPredecessorType->GetTypeHandler()->IsPathTypeHandler())"
                                        ,
                                        "currPredecessorType->GetTypeHandler()->IsPathTypeHandler()"
                                       );
            if (!bVar9) goto LAB_00c527b8;
            *puVar14 = 0;
          }
          pPVar15 = FromTypeHandler((pDVar7->typeHandler).ptr);
        } while ((pPVar15->typePath).ptr == pTVar5);
        goto LAB_00c52114;
      }
      local_58 = oldAttributes;
      if (oldAttributes == (ObjectSlotAttributes *)0x0 && TVar19 != ObjectSlotAttr_Default) {
        local_58 = UpdateAttributes((PathTypeHandlerBase *)this_00,recycler,
                                    (ObjectSlotAttributes *)0x0,oldPathSize,
                                    ((local_50->data).ptr)->pathSize);
      }
      local_68 = oldSetters;
      if (oldSetters != (PathTypeSetterSlotIndex *)0x0 || TVar19 != ObjectSlotAttr_Setter)
      goto LAB_00c52114;
      local_68 = UpdateSetterSlots(this,recycler,(PathTypeSetterSlotIndex *)0x0,oldPathSize,
                                   ((local_50->data).ptr)->pathSize);
LAB_00c5211a:
      uVar16 = TypePath::AddInternal<false>(local_50,propId);
      local_94 = '\x01';
    }
    index = (PropertyIndex)uVar16;
    uVar18 = ((this->super_DynamicTypeHandler).unusedBytes >> 1) + 1;
    uVar2 = (this->super_DynamicTypeHandler).slotCapacity;
    uVar17 = (ushort)uVar18;
    if (uVar17 <= (ushort)uVar2) {
      uVar18 = uVar2;
    }
    inlineSlotCapacity = (this->super_DynamicTypeHandler).inlineSlotCapacity;
    offsetOfInlineSlots = (this->super_DynamicTypeHandler).offsetOfInlineSlots;
    bVar9 = DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler(&this->super_DynamicTypeHandler);
    if ((bVar9) && ((this->super_DynamicTypeHandler).slotCapacity < (int)(uVar18 & 0xffff))) {
      PVar12 = DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
      inlineSlotCapacity = inlineSlotCapacity - PVar12;
      offsetOfInlineSlots = 0x20;
    }
    bVar9 = (bool)(DAT_0145c381 ^ 1 | shareType);
    if (oldAttributes == (ObjectSlotAttributes *)0x0 && TVar19 == ObjectSlotAttr_Default) {
      local_38 = (PathTypeHandlerWithAttr *)
                 PathTypeHandlerNoAttr::New
                           (scriptContext,local_50,uVar17,(PropertyIndex)uVar18,inlineSlotCapacity,
                            offsetOfInlineSlots,true,bVar9,predecessorType);
    }
    else {
      iVar13 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x71])();
      local_58[(ulong)uVar16 & 0xffff] = TVar19;
      local_38 = PathTypeHandlerWithAttr::New
                           (scriptContext,local_50,local_58,local_68,(char)iVar13 + local_94,uVar17,
                            (PropertyIndex)uVar18,inlineSlotCapacity,offsetOfInlineSlots,true,bVar9,
                            predecessorType);
    }
    if (bVar9 == false) {
      DynamicTypeHandler::SetMayBecomeShared((DynamicTypeHandler *)local_38);
    }
    bVar10 = DynamicTypeHandler::GetHasOnlyWritableDataProperties((DynamicTypeHandler *)local_38);
    if (!bVar10) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar14 = 1;
      bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                   ,0x87e,"(nextPath->GetHasOnlyWritableDataProperties())",
                                   "nextPath->GetHasOnlyWritableDataProperties()");
      if (!bVar10) goto LAB_00c527b8;
      *puVar14 = 0;
    }
    PVar11 = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
    DynamicTypeHandler::CopyPropertyTypes((DynamicTypeHandler *)local_38,0xb0,PVar11);
    PVar11 = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
    DynamicTypeHandler::SetPropertyTypes((DynamicTypeHandler *)local_38,'@',PVar11);
    if (shareType) {
      AddBlankFieldAt((PathTypeHandlerBase *)local_38,propId->pid,index,scriptContext);
    }
    if (propertyId == 0x67) {
      (local_38->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.hasUserDefinedCtor = true;
    }
    else if (propertyId < 0x10) {
      (local_38->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.hasInternalProperty = true;
    }
    iVar13 = ((this->super_DynamicTypeHandler).unusedBytes >> 1) + 1;
    if (iVar13 < scriptContext->maxPathLength) {
      iVar13 = scriptContext->maxPathLength;
    }
    scriptContext->maxPathLength = iVar13;
    local_f0 = (undefined1  [8])&DynamicType::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_9af3a56;
    data.filename._0_4_ = 0x89a;
    alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_f0);
    local_40 = (DynamicType *)new<Memory::Recycler>(0x38,alloc,0x37a1d4);
    DynamicType::DynamicType(local_40,predecessorType,(DynamicTypeHandler *)local_38,true,bVar9);
    typeWeakRef = Memory::Recycler::CreateWeakReferenceHandle<Js::DynamicType>(recycler,local_40);
    instance_00 = (char *)this;
    SetSuccessor(this,predecessorType,key,typeWeakRef,scriptContext);
    if ((local_38->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
        unusedBytes >> 1 != (ushort)((local_50->data).ptr)->pathLength) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar14 = 1;
      instance_00 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
      ;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x8aa,
                                  "(nextPath->GetPathLength() == newTypePath->GetPathLength())",
                                  "nextPath->GetPathLength() == newTypePath->GetPathLength()");
      if (!bVar9) goto LAB_00c527b8;
      *puVar14 = 0;
    }
    if ((DAT_0145c381 == 1 && !shareType) &&
       ((local_38->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
        unusedBytes >> 1 <= (ushort)((local_50->data).ptr)->maxInitializedLength)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar14 = 1;
      instance_00 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
      ;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x8ac,
                                  "(!FixPropsOnPathTypes() || shareType || nextPath->GetPathLength() > newTypePath->GetMaxInitializedLength())"
                                  ,
                                  "!FixPropsOnPathTypes() || shareType || nextPath->GetPathLength() > newTypePath->GetMaxInitializedLength()"
                                 );
      if (!bVar9) goto LAB_00c527b8;
      *puVar14 = 0;
    }
    TraceFixedFieldsAfterTypeHandlerChange
              ((DynamicObject *)instance_00,&this->super_DynamicTypeHandler,
               (DynamicTypeHandler *)local_38,predecessorType,local_40,oldSingletonInstanceBefore);
    scriptContext->promoteCount = scriptContext->promoteCount + 1;
    scriptContext->objectLiteralPromoteCount = scriptContext->objectLiteralPromoteCount + 1;
  }
  if ((DAT_0145c365 == 1) &&
     (bVar1 = (this->super_DynamicTypeHandler).flags, (bVar1 & 0x20) != 0 && (bVar1 & 0x18) != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar14 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x8d5,
                                "(!IsolatePrototypes() || !GetIsOrMayBecomeShared() || !GetIsPrototype())"
                                ,
                                "!IsolatePrototypes() || !GetIsOrMayBecomeShared() || !GetIsPrototype()"
                               );
    if (!bVar9) goto LAB_00c527b8;
    *puVar14 = 0;
  }
  DynamicTypeHandler::SetFlags
            ((DynamicTypeHandler *)local_38,(this->super_DynamicTypeHandler).flags & 0x20);
  bVar9 = DynamicTypeHandler::GetHasOnlyWritableDataProperties(&this->super_DynamicTypeHandler);
  bVar10 = DynamicTypeHandler::GetHasOnlyWritableDataProperties((DynamicTypeHandler *)local_38);
  if ((TVar19 & (ObjectSlotAttr_Accessor|ObjectSlotAttr_Writable)) == ObjectSlotAttr_Writable &&
      bVar10 != bVar9) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar14 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x8d7,
                                "(this->GetHasOnlyWritableDataProperties() == nextPath->GetHasOnlyWritableDataProperties() || !(key.GetAttributes() & ObjectSlotAttr_Writable) || (key.GetAttributes() & ObjectSlotAttr_Accessor))"
                                ,
                                "this->GetHasOnlyWritableDataProperties() == nextPath->GetHasOnlyWritableDataProperties() || !(key.GetAttributes() & ObjectSlotAttr_Writable) || (key.GetAttributes() & ObjectSlotAttr_Accessor)"
                               );
    if (!bVar9) goto LAB_00c527b8;
    *puVar14 = 0;
  }
  if (((this->super_DynamicTypeHandler).propertyTypes & 0x40) >> 6 !=
      ((local_38->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
       propertyTypes & 0x40) >> 6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar14 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x8d8,
                                "(this->GetIsInlineSlotCapacityLocked() == nextPath->GetIsInlineSlotCapacityLocked())"
                                ,
                                "this->GetIsInlineSlotCapacityLocked() == nextPath->GetIsInlineSlotCapacityLocked()"
                               );
    if (!bVar9) goto LAB_00c527b8;
    *puVar14 = 0;
  }
  PVar11 = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
  DynamicTypeHandler::SetPropertyTypes((DynamicTypeHandler *)local_38,0xa0,PVar11);
  TVar19 = (byte)~TVar19 >> 2 & TVar19 & ObjectSlotAttr_Writable;
  Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::WriteBarrierSet
            ((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)local_f0,
             &pJVar3->typesWithOnlyWritablePropertyProtoChain);
  PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<Js::PropertyRecord_const*>
            ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)local_f0,
             (DynamicTypeHandler *)local_38,TVar19,propId,scriptContext);
  Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::WriteBarrierSet
            ((WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *)local_f0,
             &pJVar3->typesWithNoSpecialPropertyProtoChain);
  PrototypeChainCache<Js::NoSpecialPropertyCache>::ProcessProperty<Js::PropertyRecord_const*>
            ((PrototypeChainCache<Js::NoSpecialPropertyCache> *)local_f0,
             (DynamicTypeHandler *)local_38,TVar19,propId,scriptContext);
  *propertyIndex = index;
  if ((PathTypeHandlerBase *)
      (((local_38->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.predecessorType.ptr)->
      typeHandler).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar14 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x8e2,"(nextPath->GetPredecessorType()->GetTypeHandler() == this)",
                                "Promoting this type to a successor with a different predecessor?");
    if (!bVar9) {
LAB_00c527b8:
      pcVar8 = (code *)invalidInstructionException();
      (*pcVar8)();
    }
    *puVar14 = 0;
  }
  return local_40;
}

Assistant:

DynamicType* PathTypeHandlerBase::PromoteType(DynamicType* predecessorType, const PathTypeSuccessorKey key, bool shareType, ScriptContext* scriptContext, DynamicObject* instance, PropertyIndex* propertyIndex)
    {
        Assert(propertyIndex != nullptr);
        Assert(isObjectLiteral || instance != nullptr);

        JavascriptLibrary* library = scriptContext->GetLibrary();
        Recycler* recycler = scriptContext->GetRecycler();
        PropertyIndex index;
        DynamicType * nextType;
        RecyclerWeakReference<DynamicType>* nextTypeWeakRef = nullptr;
        const PropertyRecord *propertyRecord = scriptContext->GetPropertyName(key.GetPropertyId());

        PathTypeHandlerBase * nextPath;
        if (!GetSuccessor(key, &nextTypeWeakRef) || (nextType = nextTypeWeakRef->Get()) == nullptr)
        {
            TypePath * newTypePath = GetTypePath();
            uint8 oldPathSize = GetTypePath()->GetPathSize();

            ObjectSlotAttributes *oldAttributes = GetAttributeArray();
            ObjectSlotAttributes *newAttributes = oldAttributes;
            PathTypeSetterSlotIndex *oldSetters = GetSetterSlots();
            PathTypeSetterSlotIndex *newSetters = oldSetters;

            bool branching = GetTypePath()->GetPathLength() > GetPathLength();
            bool growing = !branching && GetTypePath()->GetPathLength() == GetTypePath()->GetPathSize();

#if ENABLE_FIXED_FIELDS
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            DynamicType* oldType = predecessorType;
            RecyclerWeakReference<DynamicObject>* oldSingletonInstance = GetSingletonInstance();
            TraceFixedFieldsBeforeTypeHandlerChange(branching ? _u("branching") : _u("advancing"), _u("PathTypeHandler"), _u("PathTypeHandler"), instance, this, oldType, oldSingletonInstance);
#endif
#endif

            if (branching)
            {
                // We need to branch the type path.

                if (oldSetters)
                {
                    newTypePath = GetTypePath()->Branch<true>(recycler, GetPathLength(), GetIsOrMayBecomeShared() && !IsolatePrototypes(), oldAttributes);
                }
                else
                {
                    newTypePath = GetTypePath()->Branch<false>(recycler, GetPathLength(), GetIsOrMayBecomeShared() && !IsolatePrototypes());
                }

#ifdef PROFILE_TYPES
                scriptContext->branchCount++;
#endif
#ifdef PROFILE_OBJECT_LITERALS
                if (isObjectLiteral)
                {
                    scriptContext->objectLiteralBranchCount++;
                }
#endif

                if (key.GetAttributes() != ObjectSlotAttr_Default || oldAttributes != nullptr)
                {
                    newAttributes = this->UpdateAttributes(recycler, oldAttributes, oldPathSize, newTypePath->GetPathSize());
                }

                if ((key.GetAttributes() == ObjectSlotAttr_Setter) || oldSetters != nullptr)
                {
                    newSetters = this->UpdateSetterSlots(recycler, oldSetters, oldPathSize, newTypePath->GetPathSize());
                }

#if ENABLE_FIXED_FIELDS
#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
                if (PathTypeHandlerBase::FixPropsOnPathTypes())
                {
                    Assert(this->HasSingletonInstanceOnlyIfNeeded());
                    this->GetTypePath()->ClearSingletonInstanceIfSame(instance);
                }
#endif
#endif
            }
            else if (growing)
            {
                // We need to grow the type path.

                newTypePath = GetTypePath()->Grow(recycler);

                if (key.GetAttributes() != ObjectSlotAttr_Default || oldAttributes != nullptr)
                {
                    newAttributes = this->UpdateAttributes(recycler, oldAttributes, oldPathSize, newTypePath->GetPathSize());
                }

                if ((key.GetAttributes() == ObjectSlotAttr_Setter) || oldSetters != nullptr)
                {
                    newSetters = this->UpdateSetterSlots(recycler, oldSetters, oldPathSize, newTypePath->GetPathSize());
                }

                // Update all the predecessor types that use this TypePath to the new TypePath.
                // This will allow the old TypePath to be collected, and will ensure that the
                // fixed field info is correct for those types.

                PathTypeHandlerBase * typeHandlerToUpdate = this;
                TypePath * oldTypePath = GetTypePath();
                while (true)
                {
                    typeHandlerToUpdate->SetTypePath(newTypePath);
                    if (oldAttributes && typeHandlerToUpdate->GetAttributeArray() == oldAttributes)
                    {
                        typeHandlerToUpdate->SetAttributeArray(newAttributes);
                    }
                    if (oldSetters && typeHandlerToUpdate->GetSetterSlots() == oldSetters)
                    {
                        typeHandlerToUpdate->SetSetterSlots(newSetters);
                    }

                    DynamicType * currPredecessorType = typeHandlerToUpdate->GetPredecessorType();
                    if (currPredecessorType == nullptr)
                    {
                        break;
                    }

                    Assert(currPredecessorType->GetTypeHandler()->IsPathTypeHandler());
                    typeHandlerToUpdate = PathTypeHandlerBase::FromTypeHandler(currPredecessorType->GetTypeHandler());
                    if (typeHandlerToUpdate->GetTypePath() != oldTypePath)
                    {
                        break;
                    }
                }
            }
            else
            {
                if (key.GetAttributes() != ObjectSlotAttr_Default && oldAttributes == nullptr)
                {
                    newAttributes = this->UpdateAttributes(recycler, nullptr, oldPathSize, newTypePath->GetPathSize());
                }

                if ((key.GetAttributes() == ObjectSlotAttr_Setter) && oldSetters == nullptr)
                {
                    newSetters = this->UpdateSetterSlots(recycler, nullptr, oldPathSize, newTypePath->GetPathSize());
                }
            }

            bool isSetterProperty = key.GetAttributes() == ObjectSlotAttr_Setter;
            if (isSetterProperty)
            {
                // Not actually adding a property ID to the type path map here.
                index = (PropertyIndex)newTypePath->AddInternal<false>(propertyRecord);
            }
            else
            {
                index = (PropertyIndex)newTypePath->AddInternal<true>(propertyRecord);
            }

            const PropertyIndex newPropertyCount = GetPathLength() + 1;
            const PropertyIndex newSlotCapacity = max(newPropertyCount, static_cast<PropertyIndex>(GetSlotCapacity()));
            PropertyIndex newInlineSlotCapacity = GetInlineSlotCapacity();
            uint16 newOffsetOfInlineSlots = GetOffsetOfInlineSlots();
            if(IsObjectHeaderInlinedTypeHandler() && newSlotCapacity > GetSlotCapacity())
            {
                newInlineSlotCapacity -= GetObjectHeaderInlinableSlotCapacity();
                newOffsetOfInlineSlots = sizeof(DynamicObject);
            }
#if ENABLE_FIXED_FIELDS
            bool markTypeAsShared = !FixPropsOnPathTypes() || shareType;
#else
            bool markTypeAsShared = true;
#endif

            if (key.GetAttributes() == ObjectSlotAttr_Default && oldAttributes == nullptr)
            {
                nextPath = PathTypeHandlerNoAttr::New(scriptContext, newTypePath, newPropertyCount, newSlotCapacity, newInlineSlotCapacity, newOffsetOfInlineSlots, true, markTypeAsShared, predecessorType);
            }
            else
            {
                PathTypeSetterSlotIndex newSetterCount = GetSetterCount() + isSetterProperty;
                newAttributes[index] = key.GetAttributes();
                nextPath = PathTypeHandlerWithAttr::New(scriptContext, newTypePath, newAttributes, newSetters, newSetterCount, newPropertyCount, newSlotCapacity, newInlineSlotCapacity, newOffsetOfInlineSlots, true, markTypeAsShared, predecessorType);
            }
            if (!markTypeAsShared) nextPath->SetMayBecomeShared();
            Assert(nextPath->GetHasOnlyWritableDataProperties());
            nextPath->CopyPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, GetPropertyTypes());
            nextPath->SetPropertyTypes(PropertyTypesInlineSlotCapacityLocked, GetPropertyTypes());

#if ENABLE_FIXED_FIELDS
            if (shareType)
            {
                nextPath->AddBlankFieldAt(propertyRecord->GetPropertyId(), index, scriptContext);
            }
#endif

            if (key.GetPropertyId() == PropertyIds::constructor)
            {
                nextPath->hasUserDefinedCtor = true;
            }

            if (IsInternalPropertyId(key.GetPropertyId()))
            {
                nextPath->hasInternalProperty = true;
            }

#ifdef PROFILE_TYPES
            scriptContext->maxPathLength = max(GetPathLength() + 1, scriptContext->maxPathLength);
#endif

            if (isObjectLiteral)
            {
                // The new type isn't shared yet.  We will make it shared when the second instance attains it.
                nextType = RecyclerNew(recycler, DynamicType, predecessorType, nextPath, /* isLocked = */ true, /* isShared = */ markTypeAsShared);
            }
            else
            {
                // The new type isn't shared yet.  We will make it shared when the second instance attains it.
                nextType = instance->DuplicateType();
                // nextType's prototype and predecessorType's prototype can only be different here
                // only for SetPrototype scenario where predecessorType is the cachedType with newPrototype
                nextType->SetPrototype(predecessorType->GetPrototype());
                nextType->typeHandler = nextPath;
                markTypeAsShared ? nextType->SetIsLockedAndShared() : nextType->SetIsLocked();
            }

            SetSuccessor(predecessorType, key, recycler->CreateWeakReferenceHandle<DynamicType>(nextType), scriptContext);
            // We just extended the current type path to a new tip or created a brand new type path.  We should
            // be at the tip of the path and there should be no instances there yet.
            Assert(nextPath->GetPathLength() == newTypePath->GetPathLength());
#if ENABLE_FIXED_FIELDS
            Assert(!FixPropsOnPathTypes() || shareType || nextPath->GetPathLength() > newTypePath->GetMaxInitializedLength());
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            TraceFixedFieldsAfterTypeHandlerChange(instance, this, nextPath, oldType, nextType, oldSingletonInstance);
#endif
#endif
#ifdef PROFILE_TYPES
            scriptContext->promoteCount++;
#endif
#ifdef PROFILE_OBJECT_LITERALS
            if (isObjectLiteral)
            {
                scriptContext->objectLiteralPromoteCount++;
            }
#endif
        }
        else
        {
#ifdef PROFILE_TYPES
            scriptContext->cacheCount++;
#endif

            // Now that the second (or subsequent) instance reached this type, make sure that it's shared.
            nextPath = (PathTypeHandlerBase *)nextType->GetTypeHandler();
            Assert(nextPath->GetIsInlineSlotCapacityLocked() == this->GetIsInlineSlotCapacityLocked());

            index = nextPath->GetPropertyIndex(propertyRecord);

#if ENABLE_FIXED_FIELDS
            Assert((FixPropsOnPathTypes() && nextPath->GetMayBecomeShared()) || (nextPath->GetIsShared() && nextType->GetIsShared()));
            if (FixPropsOnPathTypes() && !nextType->GetIsShared())
            {
                if (!nextPath->GetIsShared())
                {
                    nextPath->AddBlankFieldAt(propertyRecord->GetPropertyId(), index, scriptContext);
                    nextPath->DoShareTypeHandlerInternal<true>(scriptContext);
                }
                nextType->ShareType();
            }
#endif
        }

        Assert(!IsolatePrototypes() || !GetIsOrMayBecomeShared() || !GetIsPrototype());
        nextPath->SetFlags(IsPrototypeFlag, this->GetFlags());
        Assert(this->GetHasOnlyWritableDataProperties() == nextPath->GetHasOnlyWritableDataProperties() || !(key.GetAttributes() & ObjectSlotAttr_Writable) || (key.GetAttributes() & ObjectSlotAttr_Accessor));
        Assert(this->GetIsInlineSlotCapacityLocked() == nextPath->GetIsInlineSlotCapacityLocked());
        nextPath->SetPropertyTypes(PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, this->GetPropertyTypes());

        PropertyAttributes isWritableAttribute = ((key.GetAttributes() & ObjectSlotAttr_Writable) && !(key.GetAttributes() & ObjectSlotAttr_Accessor)) ? PropertyWritable : PropertyNone;
        library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(nextPath, isWritableAttribute, propertyRecord, scriptContext);
        library->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(nextPath, isWritableAttribute, propertyRecord, scriptContext);

        (*propertyIndex) = index;

#if DBG
        AssertMsg(nextPath->GetPredecessorType()->GetTypeHandler() == this, "Promoting this type to a successor with a different predecessor?");
#endif

        return nextType;
    }